

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::section(Solver *this,char *title)

{
  State *pSVar1;
  void *in_RSI;
  Solver *in_RDI;
  Internal *unaff_retaddr;
  Solver *title_00;
  
  title_00 = in_RDI;
  pSVar1 = state(in_RDI);
  if (*pSVar1 != DELETING) {
    require_solver_pointer_to_be_non_zero(in_RSI,&in_RDI->adding_clause,(char *)0xe2d704);
    if (in_RDI->external == (External *)0x0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "void CaDiCaL::Solver::section(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"external solver not initialized");
      fputc(10,_stderr);
      fflush(_stderr);
      abort();
    }
    if (in_RDI->internal == (Internal *)0x0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "void CaDiCaL::Solver::section(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"internal solver not initialized");
      fputc(10,_stderr);
      fflush(_stderr);
      abort();
    }
    if (in_RDI->internal != (Internal *)0x0) {
      Internal::section(unaff_retaddr,&title_00->adding_clause);
    }
  }
  return;
}

Assistant:

void Solver::section (const char *title) {
  if (state () == DELETING)
    return;
#ifdef QUIET
  (void) title;
#endif
  REQUIRE_INITIALIZED ();
  SECTION (title);
}